

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# by_file.cc
# Opt level: O0

int X509_load_cert_crl_file(X509_LOOKUP *ctx,char *file,int type)

{
  int iVar1;
  BIO *bp;
  stack_st_X509_INFO *sk;
  size_t sVar2;
  X509_INFO *pXVar3;
  int local_4c;
  ulong uStack_48;
  int count;
  size_t i;
  BIO *in;
  X509_INFO *itmp;
  stack_st_X509_INFO *inf;
  int type_local;
  char *file_local;
  X509_LOOKUP *ctx_local;
  
  local_4c = 0;
  if (type == 1) {
    bp = BIO_new_file(file,"rb");
    if (bp == (BIO *)0x0) {
      ERR_put_error(0xb,0,2,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/by_file.cc"
                    ,0xbf);
      ctx_local._4_4_ = 0;
    }
    else {
      sk = (stack_st_X509_INFO *)
           PEM_X509_INFO_read_bio(bp,(stack_st_X509_INFO *)0x0,(undefined1 *)0x0,(void *)0x0);
      BIO_free(bp);
      if (sk == (stack_st_X509_INFO *)0x0) {
        ERR_put_error(0xb,0,9,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/by_file.cc"
                      ,0xc5);
        ctx_local._4_4_ = 0;
      }
      else {
        for (uStack_48 = 0; sVar2 = sk_X509_INFO_num(sk), uStack_48 < sVar2;
            uStack_48 = uStack_48 + 1) {
          pXVar3 = sk_X509_INFO_value(sk,uStack_48);
          if (pXVar3->x509 != (X509 *)0x0) {
            iVar1 = X509_STORE_add_cert((X509_STORE *)ctx->method_data,(X509 *)pXVar3->x509);
            if (iVar1 == 0) goto LAB_004aadaf;
            local_4c = local_4c + 1;
          }
          if (pXVar3->crl != (X509_CRL *)0x0) {
            iVar1 = X509_STORE_add_crl((X509_STORE *)ctx->method_data,(X509_CRL *)pXVar3->crl);
            if (iVar1 == 0) goto LAB_004aadaf;
            local_4c = local_4c + 1;
          }
        }
        if (local_4c == 0) {
          ERR_put_error(0xb,0,0x8e,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/by_file.cc"
                        ,0xd9);
        }
LAB_004aadaf:
        sk_X509_INFO_pop_free(sk,X509_INFO_free);
        ctx_local._4_4_ = local_4c;
      }
    }
  }
  else {
    ctx_local._4_4_ = X509_load_cert_file(ctx,file,type);
  }
  return ctx_local._4_4_;
}

Assistant:

int X509_load_cert_crl_file(X509_LOOKUP *ctx, const char *file, int type) {
  STACK_OF(X509_INFO) *inf;
  X509_INFO *itmp;
  BIO *in;
  size_t i;
  int count = 0;

  if (type != X509_FILETYPE_PEM) {
    return X509_load_cert_file(ctx, file, type);
  }
  in = BIO_new_file(file, "rb");
  if (!in) {
    OPENSSL_PUT_ERROR(X509, ERR_R_SYS_LIB);
    return 0;
  }
  inf = PEM_X509_INFO_read_bio(in, NULL, NULL, NULL);
  BIO_free(in);
  if (!inf) {
    OPENSSL_PUT_ERROR(X509, ERR_R_PEM_LIB);
    return 0;
  }
  for (i = 0; i < sk_X509_INFO_num(inf); i++) {
    itmp = sk_X509_INFO_value(inf, i);
    if (itmp->x509) {
      if (!X509_STORE_add_cert(ctx->store_ctx, itmp->x509)) {
        goto err;
      }
      count++;
    }
    if (itmp->crl) {
      if (!X509_STORE_add_crl(ctx->store_ctx, itmp->crl)) {
        goto err;
      }
      count++;
    }
  }

  if (count == 0) {
    OPENSSL_PUT_ERROR(X509, X509_R_NO_CERTIFICATE_OR_CRL_FOUND);
  }

err:
  sk_X509_INFO_pop_free(inf, X509_INFO_free);
  return count;
}